

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLVisualSceneLoader.cpp
# Opt level: O0

void __thiscall
COLLADASaxFWL::VisualSceneLoader::VisualSceneLoader
          (VisualSceneLoader *this,IFilePartLoader *callingFilePartLoader,char *id)

{
  UniqueId *uniqueId;
  VisualScene *in_RDI;
  ClassId in_stack_0000012c;
  ParserChar *in_stack_00000130;
  IFilePartLoader *in_stack_00000138;
  IFilePartLoader *in_stack_ffffffffffffff88;
  FilePartLoader *in_stack_ffffffffffffff90;
  NodeLoader *in_stack_ffffffffffffffa0;
  size_t *psVar1;
  UniqueId local_40 [2];
  
  FilePartLoader::FilePartLoader(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  NodeLoader::NodeLoader(in_stack_ffffffffffffffa0);
  (in_RDI->super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)425>).super_Object._vptr_Object =
       (_func_int **)&PTR__VisualSceneLoader_00dbfb88;
  *(undefined ***)&in_RDI->mName = &PTR__VisualSceneLoader_00dbfc28;
  psVar1 = &in_RDI[2].mRootNodes.super_ArrayPrimitiveType<COLLADAFW::Node_*>.mCount;
  uniqueId = (UniqueId *)operator_new(0x68);
  COLLADAFW::ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)425>::ID();
  IFilePartLoader::createUniqueIdFromId(in_stack_00000138,in_stack_00000130,in_stack_0000012c);
  COLLADAFW::VisualScene::VisualScene(in_RDI,uniqueId);
  COLLADAFW::UniqueId::~UniqueId(local_40);
  *psVar1 = (size_t)uniqueId;
  *(undefined1 *)&in_RDI[2].mRootNodes.super_ArrayPrimitiveType<COLLADAFW::Node_*>.mCapacity = 0;
  HelperLoaderBase::setHandlingFilePartLoader
            ((HelperLoaderBase *)&in_RDI->mName,(FilePartLoader *)in_RDI);
  return;
}

Assistant:

VisualSceneLoader::VisualSceneLoader( IFilePartLoader* callingFilePartLoader, const char* id )
		: FilePartLoader(callingFilePartLoader)
        , mVisualScene(new COLLADAFW::VisualScene(createUniqueIdFromId(id, COLLADAFW::VisualScene::ID())))
        , mInNode (false)
	{
		NodeLoader::setHandlingFilePartLoader(this);
	}